

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O2

coda_product_type *
coda_product_class_get_product_type(coda_product_class *product_class,char *name)

{
  long lVar1;
  coda_product_type *pcVar2;
  
  lVar1 = coda_hashtable_get_index_from_name(product_class->product_type_hash_data,name);
  if ((int)lVar1 == -1) {
    pcVar2 = (coda_product_type *)0x0;
    coda_set_error(-400,"product class %s does not contain a product type with name %s",
                   product_class->name,name);
  }
  else {
    pcVar2 = product_class->product_type[(int)lVar1];
  }
  return pcVar2;
}

Assistant:

coda_product_type *coda_product_class_get_product_type(const coda_product_class *product_class, const char *name)
{
    int index;

    index = hashtable_get_index_from_name(product_class->product_type_hash_data, name);
    if (index == -1)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "product class %s does not contain a product type with name %s",
                       product_class->name, name);
        return NULL;
    }

    return product_class->product_type[index];
}